

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int __thiscall
P_Alternation::match(P_Alternation *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  reference o;
  reference ppPVar1;
  size_type local_88;
  size_t i;
  StateP sp;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  P_Alternation *this_local;
  
  sp._96_8_ = stk;
  o = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
  StateP::StateP((StateP *)&i,o);
  std::vector<StateP,_std::allocator<StateP>_>::pop_back
            ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
  local_88 = std::vector<P_Sequence_*,_std::allocator<P_Sequence_*>_>::size(&this->v);
  while (local_88 != 0) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back
              ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_,(value_type *)&i);
    ppPVar1 = std::vector<P_Sequence_*,_std::allocator<P_Sequence_*>_>::operator[]
                        (&this->v,local_88 - 1);
    P_Sequence::match(*ppPVar1,(vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
    local_88 = local_88 - 1;
  }
  StateP::~StateP((StateP *)&i);
  return 0;
}

Assistant:

int P_Alternation::match(vector<StateP> &stk) {
    StateP sp = stk.back(); stk.pop_back();

    for (size_t i = v.size(); i--; ) {
        stk.push_back(sp);
        v[i]->match(stk);
    }
    return 0;
}